

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# status_internal.cc
# Opt level: O2

bool __thiscall
absl::lts_20250127::status_internal::StatusRep::operator==(StatusRep *this,StatusRep *other)

{
  ulong uVar1;
  ulong uVar2;
  Storage<unsigned_long,_1UL,_false> SVar3;
  bool bVar4;
  __type _Var5;
  bool bVar6;
  Storage<absl::lts_20250127::status_internal::Payload,_1UL,_std::allocator<absl::lts_20250127::status_internal::Payload>_>
  *pSVar7;
  Pointer<std::allocator<absl::lts_20250127::status_internal::Payload>_> pPVar8;
  Storage<absl::lts_20250127::status_internal::Payload,_1UL,_std::allocator<absl::lts_20250127::status_internal::Payload>_>
  *pSVar9;
  Storage<absl::lts_20250127::status_internal::Payload,_1UL,_std::allocator<absl::lts_20250127::status_internal::Payload>_>
  *pSVar10;
  Pointer<std::allocator<absl::lts_20250127::status_internal::Payload>_> pPVar11;
  ulong uVar12;
  ulong uVar13;
  Storage<absl::lts_20250127::status_internal::Payload,_1UL,_std::allocator<absl::lts_20250127::status_internal::Payload>_>
  *pSVar14;
  Storage<absl::lts_20250127::status_internal::Payload,_1UL,_std::allocator<absl::lts_20250127::status_internal::Payload>_>
  *pSVar15;
  ulong uVar16;
  long lVar17;
  Payload *payload;
  Pointer<std::allocator<absl::lts_20250127::status_internal::Payload>_> __lhs;
  Pointer<std::allocator<absl::lts_20250127::status_internal::Payload>_> __rhs;
  Payloads no_payloads;
  Storage<absl::lts_20250127::status_internal::Payload,_1UL,_std::allocator<absl::lts_20250127::status_internal::Payload>_>
  local_68;
  
  if (this == other) {
    __assert_fail("this != &other",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/status/internal/status_internal.cc"
                  ,0x9e,"bool absl::status_internal::StatusRep::operator==(const StatusRep &) const"
                 );
  }
  if ((this->code_ != other->code_) ||
     (bVar4 = std::operator!=(&this->message_,&other->message_), bVar4)) {
    bVar4 = false;
  }
  else {
    pSVar9 = &((this->payloads_)._M_t.
               super___uniq_ptr_impl<absl::lts_20250127::InlinedVector<absl::lts_20250127::status_internal::Payload,_1UL,_std::allocator<absl::lts_20250127::status_internal::Payload>_>,_std::default_delete<absl::lts_20250127::InlinedVector<absl::lts_20250127::status_internal::Payload,_1UL,_std::allocator<absl::lts_20250127::status_internal::Payload>_>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_absl::lts_20250127::InlinedVector<absl::lts_20250127::status_internal::Payload,_1UL,_std::allocator<absl::lts_20250127::status_internal::Payload>_>_*,_std::default_delete<absl::lts_20250127::InlinedVector<absl::lts_20250127::status_internal::Payload,_1UL,_std::allocator<absl::lts_20250127::status_internal::Payload>_>_>_>
               .
               super__Head_base<0UL,_absl::lts_20250127::InlinedVector<absl::lts_20250127::status_internal::Payload,_1UL,_std::allocator<absl::lts_20250127::status_internal::Payload>_>_*,_false>
              ._M_head_impl)->storage_;
    pSVar10 = &((other->payloads_)._M_t.
                super___uniq_ptr_impl<absl::lts_20250127::InlinedVector<absl::lts_20250127::status_internal::Payload,_1UL,_std::allocator<absl::lts_20250127::status_internal::Payload>_>,_std::default_delete<absl::lts_20250127::InlinedVector<absl::lts_20250127::status_internal::Payload,_1UL,_std::allocator<absl::lts_20250127::status_internal::Payload>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_absl::lts_20250127::InlinedVector<absl::lts_20250127::status_internal::Payload,_1UL,_std::allocator<absl::lts_20250127::status_internal::Payload>_>_*,_std::default_delete<absl::lts_20250127::InlinedVector<absl::lts_20250127::status_internal::Payload,_1UL,_std::allocator<absl::lts_20250127::status_internal::Payload>_>_>_>
                .
                super__Head_base<0UL,_absl::lts_20250127::InlinedVector<absl::lts_20250127::status_internal::Payload,_1UL,_std::allocator<absl::lts_20250127::status_internal::Payload>_>_*,_false>
               ._M_head_impl)->storage_;
    local_68.metadata_.
    super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<std::allocator<absl::lts_20250127::status_internal::Payload>,_unsigned_long>,_std::integer_sequence<unsigned_long,_0UL,_1UL>,_true>
    .super_Storage<unsigned_long,_1UL,_false>.value =
         (CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<std::allocator<absl::lts_20250127::status_internal::Payload>,_unsigned_long>,_std::integer_sequence<unsigned_long,_0UL,_1UL>,_true>
          )(Storage<unsigned_long,_1UL,_false>)0x0;
    pSVar14 = pSVar9;
    if (pSVar9 == (Storage<absl::lts_20250127::status_internal::Payload,_1UL,_std::allocator<absl::lts_20250127::status_internal::Payload>_>
                   *)0x0) {
      pSVar14 = &local_68;
    }
    pSVar15 = pSVar10;
    if (pSVar10 ==
        (Storage<absl::lts_20250127::status_internal::Payload,_1UL,_std::allocator<absl::lts_20250127::status_internal::Payload>_>
         *)0x0) {
      pSVar15 = &local_68;
    }
    uVar1 = (pSVar14->metadata_).
            super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<std::allocator<absl::lts_20250127::status_internal::Payload>,_unsigned_long>,_std::integer_sequence<unsigned_long,_0UL,_1UL>,_true>
            .super_Storage<unsigned_long,_1UL,_false>.value;
    uVar12 = uVar1 >> 1;
    uVar2 = (pSVar15->metadata_).
            super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<std::allocator<absl::lts_20250127::status_internal::Payload>,_unsigned_long>,_std::integer_sequence<unsigned_long,_0UL,_1UL>,_true>
            .super_Storage<unsigned_long,_1UL,_false>.value;
    uVar16 = uVar2 >> 1;
    uVar13 = uVar2;
    if (uVar12 < uVar16) {
      uVar13 = uVar1;
      uVar1 = uVar2;
    }
    if ((uVar1 >> 1) - (uVar13 >> 1) < 2) {
      if (pSVar10 ==
          (Storage<absl::lts_20250127::status_internal::Payload,_1UL,_std::allocator<absl::lts_20250127::status_internal::Payload>_>
           *)0x0) {
        pSVar10 = &local_68;
      }
      if (pSVar9 == (Storage<absl::lts_20250127::status_internal::Payload,_1UL,_std::allocator<absl::lts_20250127::status_internal::Payload>_>
                     *)0x0) {
        pSVar9 = &local_68;
      }
      pSVar7 = pSVar9;
      if (uVar12 < uVar16) {
        pSVar7 = pSVar10;
      }
      pPVar11 = (Pointer<std::allocator<absl::lts_20250127::status_internal::Payload>_>)
                &pSVar10->data_;
      __lhs = (Pointer<std::allocator<absl::lts_20250127::status_internal::Payload>_>)&pSVar9->data_
      ;
      if (uVar12 < uVar16) {
        pPVar11 = (Pointer<std::allocator<absl::lts_20250127::status_internal::Payload>_>)
                  &pSVar9->data_;
        __lhs = (Pointer<std::allocator<absl::lts_20250127::status_internal::Payload>_>)
                &pSVar10->data_;
      }
      if ((uVar1 & 1) != 0) {
        __lhs = (pSVar7->data_).allocated.allocated_data;
      }
      pPVar8 = __lhs + (uVar1 >> 1);
      do {
        bVar4 = __lhs == pPVar8;
        if (bVar4) {
          bVar4 = true;
          break;
        }
        pSVar9 = pSVar15;
        if (uVar12 < uVar16) {
          pSVar9 = pSVar14;
        }
        SVar3.value = (pSVar9->metadata_).
                      super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<std::allocator<absl::lts_20250127::status_internal::Payload>,_unsigned_long>,_std::integer_sequence<unsigned_long,_0UL,_1UL>,_true>
                      .super_Storage<unsigned_long,_1UL,_false>.value;
        __rhs = pPVar11;
        if ((SVar3.value & 1) != 0) {
          __rhs = (((Data *)&pPVar11->type_url)->allocated).allocated_data;
        }
        lVar17 = (SVar3.value >> 1) * 0x30;
        while( true ) {
          if (lVar17 == 0) goto LAB_003c898c;
          _Var5 = std::operator==(&__lhs->type_url,&__rhs->type_url);
          if (_Var5) break;
          __rhs = __rhs + 1;
          lVar17 = lVar17 + -0x30;
        }
        bVar6 = lts_20250127::operator!=(&__lhs->payload,&__rhs->payload);
        __lhs = __lhs + 1;
      } while (!bVar6);
    }
    else {
LAB_003c898c:
      bVar4 = false;
    }
    inlined_vector_internal::
    Storage<absl::lts_20250127::status_internal::Payload,_1UL,_std::allocator<absl::lts_20250127::status_internal::Payload>_>
    ::~Storage(&local_68);
  }
  return bVar4;
}

Assistant:

bool StatusRep::operator==(const StatusRep& other) const {
  assert(this != &other);
  if (code_ != other.code_) return false;
  if (message_ != other.message_) return false;
  const status_internal::Payloads* this_payloads = payloads_.get();
  const status_internal::Payloads* other_payloads = other.payloads_.get();

  const status_internal::Payloads no_payloads;
  const status_internal::Payloads* larger_payloads =
      this_payloads ? this_payloads : &no_payloads;
  const status_internal::Payloads* smaller_payloads =
      other_payloads ? other_payloads : &no_payloads;
  if (larger_payloads->size() < smaller_payloads->size()) {
    std::swap(larger_payloads, smaller_payloads);
  }
  if ((larger_payloads->size() - smaller_payloads->size()) > 1) return false;
  // Payloads can be ordered differently, so we can't just compare payload
  // vectors.
  for (const auto& payload : *larger_payloads) {

    bool found = false;
    for (const auto& other_payload : *smaller_payloads) {
      if (payload.type_url == other_payload.type_url) {
        if (payload.payload != other_payload.payload) {
          return false;
        }
        found = true;
        break;
      }
    }
    if (!found) return false;
  }
  return true;
}